

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledCompression.cpp
# Opt level: O3

void testTiledCompression(string *tempDir)

{
  int h;
  int xs;
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  char cVar5;
  ushort uVar6;
  undefined4 uVar7;
  uint uVar8;
  half *__s;
  float *__s_00;
  void *__s_01;
  ostream *poVar9;
  long *plVar10;
  long lVar11;
  float fVar12;
  int y;
  int x;
  ulong uVar13;
  half *phVar14;
  long lVar15;
  Array2D<Imath_3_2::half> ph;
  Array2D<unsigned_int> pi;
  Array2D<float> pf;
  int in_stack_ffffffffffffff20;
  void *pvVar16;
  float *pfVar17;
  long local_b8;
  ushort local_a6 [3];
  string *local_a0;
  Array2D<float> local_98;
  Array2D<Imath_3_2::half> local_80;
  long local_68;
  double local_60;
  double local_58;
  double local_50;
  undefined8 local_48;
  undefined8 local_40;
  void *local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Testing pixel data types and data window offsets for tiled files",0x40);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  local_80._sizeX = 0x3b;
  local_80._sizeY = 0xab;
  __s = (half *)operator_new__(0x9da4);
  local_98._sizeX = 0x3b;
  local_98._sizeY = 0xab;
  local_80._data = __s;
  __s_00 = (float *)operator_new__(0x4ed2);
  local_48 = 0x3b;
  local_40 = 0xab;
  local_98._data = __s_00;
  __s_01 = operator_new__(0x9da4);
  local_b8 = 0;
  local_a0 = tempDir;
  local_38 = __s_01;
  do {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    poVar9 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"xOffset = ",10);
    h = *(int *)(&DAT_001c7ce8 + local_b8 * 4);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,h);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,", yOffset = ",0xc);
    xs = *(int *)(&DAT_001c7cf4 + local_b8 * 4);
    plVar10 = (long *)std::ostream::operator<<(poVar9,xs);
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"only zeroes",0xb);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    memset(__s,0,0x9da4);
    memset(__s_00,0,0x4ed2);
    memset(__s_01,0,0x9da4);
    anon_unknown.dwarf_31645a::writeRead
              ((string *)(tempDir->_M_dataplus)._M_p,
               (Array2D<unsigned_int> *)tempDir->_M_string_length,&local_80,&local_98,(int)&local_48
               ,h,xs,in_stack_ffffffffffffff20,(int)__s_01,(int)__s_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"pattern 1",9);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    testTiledCompression();
    anon_unknown.dwarf_31645a::writeRead
              ((string *)(tempDir->_M_dataplus)._M_p,
               (Array2D<unsigned_int> *)tempDir->_M_string_length,&local_80,&local_98,(int)&local_48
               ,h,xs,in_stack_ffffffffffffff20,(int)__s_01,(int)__s_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"pattern 2",9);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    lVar11 = 0;
    phVar14 = __s;
    pvVar16 = __s_01;
    pfVar17 = __s_00;
    do {
      local_58 = (double)(int)lVar11;
      local_60 = local_58 * 0.5;
      uVar13 = 0;
      local_68 = lVar11;
      do {
        iVar3 = (int)uVar13;
        iVar4 = iVar3 + -100;
        if (uVar13 < 100) {
          iVar4 = iVar3;
        }
        *(int *)(phVar14 + uVar13 * 2) = iVar4 + (int)lVar11 * 100;
        local_50 = (double)iVar3;
        dVar1 = sin(local_50);
        dVar2 = sin(local_60);
        fVar12 = ABS((float)(dVar2 + dVar1));
        uVar6 = (ushort)((uint)(float)(dVar2 + dVar1) >> 0x10) & 0x8000;
        if ((uint)fVar12 < 0x38800000) {
          if ((0x33000000 < (uint)fVar12) &&
             (uVar8 = (uint)fVar12 & 0x7fffff | 0x800000, cVar5 = (char)((uint)fVar12 >> 0x17),
             uVar6 = uVar6 | (ushort)(uVar8 >> (0x7eU - cVar5 & 0x1f)),
             0x80000000 < uVar8 << (cVar5 + 0xa2U & 0x1f))) {
            uVar6 = uVar6 + 1;
          }
        }
        else if ((uint)fVar12 < 0x7f800000) {
          if ((uint)fVar12 < 0x477ff000) {
            uVar6 = (ushort)((int)fVar12 + 0x8000fff + (uint)(((uint)fVar12 >> 0xd & 1) != 0) >> 0xd
                            ) | uVar6;
          }
          else {
            uVar6 = uVar6 | 0x7c00;
          }
        }
        else {
          uVar6 = uVar6 | 0x7c00;
          if (fVar12 != INFINITY) {
            uVar8 = (uint)fVar12 >> 0xd & 0x3ff;
            uVar6 = uVar6 | (ushort)uVar8 | (ushort)(uVar8 == 0);
          }
        }
        *(ushort *)((long)__s_00 + uVar13 * 2) = uVar6;
        dVar1 = sin(local_58);
        dVar2 = sin(local_50 * 0.5);
        *(float *)((long)__s_01 + uVar13 * 4) = (float)(dVar2 + dVar1);
        uVar13 = uVar13 + 1;
      } while (uVar13 != 0xab);
      lVar11 = local_68 + 1;
      __s_01 = (void *)((long)__s_01 + 0x2ac);
      __s_00 = (float *)((long)__s_00 + 0x156);
      phVar14 = phVar14 + 0x156;
    } while (lVar11 != 0x3b);
    anon_unknown.dwarf_31645a::writeRead
              ((string *)(local_a0->_M_dataplus)._M_p,
               (Array2D<unsigned_int> *)local_a0->_M_string_length,&local_80,&local_98,
               (int)&local_48,h,xs,in_stack_ffffffffffffff20,(int)pvVar16,(int)pfVar17);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"random bits",0xb);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    local_a6[0] = 0x5a5a;
    local_a6[1] = 0x5a5a;
    local_a6[2] = 0x5a5a;
    lVar11 = 0;
    do {
      lVar15 = 0;
      __s_01 = pvVar16;
      __s_00 = pfVar17;
      do {
        uVar7 = Imath_3_2::nrand48(local_a6);
        *(undefined4 *)(__s + lVar11 * 0x156 + lVar15 * 2) = uVar7;
        do {
          do {
            uVar6 = Imath_3_2::nrand48(local_a6);
            *(ushort *)((long)pfVar17 + lVar15 * 2 + lVar11 * 0x156) = uVar6;
          } while ((uVar6 & 0x7fff) == 0x7c00);
        } while ((~uVar6 & 0x7c00) == 0 && (uVar6 & 0x3ff) != 0);
        do {
          uVar8 = Imath_3_2::nrand48(local_a6);
          tempDir = local_a0;
          *(uint *)((long)pvVar16 + lVar15 * 4 + lVar11 * 0x2ac) = uVar8;
        } while (0x7f7fffff < (uVar8 & 0x7fffffff));
        lVar15 = lVar15 + 1;
      } while (lVar15 != 0xab);
      lVar11 = lVar11 + 1;
      pvVar16 = __s_01;
      pfVar17 = __s_00;
    } while (lVar11 != 0x3b);
    anon_unknown.dwarf_31645a::writeRead
              ((string *)(local_a0->_M_dataplus)._M_p,
               (Array2D<unsigned_int> *)local_a0->_M_string_length,&local_80,&local_98,
               (int)&local_48,h,xs,in_stack_ffffffffffffff20,(int)__s_01,(int)__s_00);
    local_b8 = local_b8 + 1;
  } while (local_b8 != 3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok\n",3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  operator_delete__(__s_01);
  operator_delete__(__s_00);
  operator_delete__(__s);
  return;
}

Assistant:

void
testTiledCompression (const std::string& tempDir)
{
    try
    {
        cout << "Testing pixel data types and data "
                "window offsets for tiled files"
             << endl;

        const int W    = 171;
        const int H    = 59;
        const int DX[] = {-17, 0, 23};
        const int DY[] = {-29, 0, 13};
        const int XS   = 15;
        const int YS   = 15;

        Array2D<unsigned int> pi (H, W);
        Array2D<half>         ph (H, W);
        Array2D<float>        pf (H, W);

        //
        // If the following assertion fails, new pixel types have
        // been added to the Imf library; testing code for the new
        // pixel types should be added to this file.
        //

        assert (NUM_PIXELTYPES == 3);

        for (int i = 0; i < 3; ++i)
        {
            cout << endl
                 << "xOffset = " << DX[i]
                 << ", "
                    "yOffset = "
                 << DY[i] << endl;

            fillPixels1 (pi, ph, pf, W, H);
            writeRead (tempDir, pi, ph, pf, W, H, XS, YS, DX[i], DY[i]);

            fillPixels2 (pi, ph, pf, W, H);
            writeRead (tempDir, pi, ph, pf, W, H, XS, YS, DX[i], DY[i]);

            fillPixels3 (pi, ph, pf, W, H);
            writeRead (tempDir, pi, ph, pf, W, H, XS, YS, DX[i], DY[i]);

            fillPixels4 (pi, ph, pf, W, H);
            writeRead (tempDir, pi, ph, pf, W, H, XS, YS, DX[i], DY[i]);
        }

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}